

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_group.h
# Opt level: O3

bool BASELINE::baseline_enabled(example *ec)

{
  float *pfVar1;
  float *pfVar2;
  unsigned_long *puVar3;
  
  pfVar2 = (ec->super_example_predict).feature_space[0x89].values._begin;
  pfVar1 = (ec->super_example_predict).feature_space[0x89].values._end;
  if (pfVar2 != pfVar1) {
    puVar3 = (ec->super_example_predict).feature_space[0x89].indicies._begin;
    do {
      if (*puVar3 == 0x54d) {
        return (bool)(-(*pfVar2 == 1.0) & 1);
      }
      pfVar2 = pfVar2 + 1;
      puVar3 = puVar3 + 1;
    } while (pfVar2 != pfVar1);
  }
  return false;
}

Assistant:

iterator begin() { return iterator(values.begin(), indicies.begin()); }